

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

uint32_t __thiscall
libtorrent::aux::utp_socket_impl::ack_packet
          (utp_socket_impl *this,packet_ptr *p,time_point receive_time,uint16_t seq_nr)

{
  undefined2 uVar1;
  packet *ppVar2;
  time_point tVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ulong uVar6;
  _Head_base<0UL,_libtorrent::aux::packet_*,_false> local_20;
  
  ppVar2 = (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
           ._M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
           super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
  if ((ppVar2->field_0xe & 0x40) == 0) {
    this->m_bytes_in_flight =
         this->m_bytes_in_flight + ((uint)ppVar2->header_size - (uint)ppVar2->size);
  }
  if (this->m_mtu_seq != 0 && this->m_mtu_seq == seq_nr) {
    uVar1 = this->m_mtu_floor;
    uVar5 = ppVar2->size;
    if (ppVar2->size < (ushort)uVar1) {
      uVar5 = uVar1;
    }
    this->m_mtu_floor = uVar5;
    update_mtu_limits(this);
  }
  maybe_inc_acked_seq_nr(this);
  tVar3.__d.__r =
       (((p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
         _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
         super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl)->send_time).__d;
  auVar4 = SEXT816((long)receive_time.__d.__r - (long)tVar3.__d.__r) * SEXT816(0x20c49ba5e353f7cf);
  uVar6 = 100000;
  if ((long)tVar3.__d.__r <= (long)receive_time.__d.__r) {
    uVar6 = (ulong)(uint)((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f));
  }
  sliding_average<int,_16>::add_sample(&this->m_rtt,(int)(uVar6 / 1000));
  local_20._M_head_impl =
       (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
       _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
       super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
  (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
  super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl = (packet *)0x0;
  release_packet(this,(packet_ptr *)&local_20);
  if (local_20._M_head_impl != (packet *)0x0) {
    free(local_20._M_head_impl);
  }
  return (uint32_t)uVar6;
}

Assistant:

std::uint32_t utp_socket_impl::ack_packet(packet_ptr p, time_point const receive_time
	, std::uint16_t seq_nr)
{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
//	INVARIANT_CHECK;
#endif

	TORRENT_ASSERT(p);

	// verify that the packet we're removing was in fact sent
	// with the sequence number we expect
//	TORRENT_ASSERT(reinterpret_cast<utp_header*>(p->buf)->seq_nr == seq_nr);

	if (!p->need_resend)
	{
		TORRENT_ASSERT(m_bytes_in_flight >= p->size - p->header_size);
		m_bytes_in_flight -= p->size - p->header_size;
	}

	if (seq_nr == m_mtu_seq && m_mtu_seq != 0)
	{
		TORRENT_ASSERT(p->mtu_probe);
		// our mtu probe was acked!
		m_mtu_floor = std::max(m_mtu_floor, p->size);
		update_mtu_limits();
	}

	// increment the acked sequence number counter
	maybe_inc_acked_seq_nr();

	auto rtt = static_cast<std::uint32_t>(total_microseconds(receive_time - p->send_time));
	if (receive_time < p->send_time)
	{
		// this means our clock is not monotonic. Just assume the RTT was 100 ms
		rtt = 100000;

		// the clock for this platform is not monotonic!
		TORRENT_ASSERT_FAIL();
	}

	UTP_LOGV("%8p: acked packet %d (%d bytes) (rtt:%u)\n"
		, static_cast<void*>(this), seq_nr, p->size - p->header_size, rtt / 1000);

	m_rtt.add_sample(rtt / 1000);
	release_packet(std::move(p));
	return rtt;
}